

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDefaultVertexAttributeTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::DefaultVertexAttributeTests::init
          (DefaultVertexAttributeTests *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  TestContext *testCtx;
  char *__rhs;
  Context *pCVar2;
  DataType DVar3;
  undefined8 in_RAX;
  TestNode *this_00;
  AttributeCase *pAVar4;
  FloatLoader *pFVar5;
  undefined8 extraout_RAX;
  long lVar6;
  undefined1 in_stack_ffffffffffffff68;
  allocator<char> local_95;
  DataType local_94;
  TestNode *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  AttributeCase *local_60;
  long local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar6 = 0xc;
  while (lVar6 != 0x7c) {
    this_00 = (TestNode *)operator_new(0x70);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    __rhs = *(char **)((long)&PTR_iterate_01e22a10 + lVar6 + 4);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"test with ",&local_95);
    std::operator+(&local_80,&local_50,__rhs);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)this_00,testCtx,__rhs,local_80._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_50);
    cVar1 = *(char *)((long)&init::floatTargets[0].name + lVar6);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    local_94 = *(DataType *)(&UNK_01e22a1c + lVar6);
    local_58 = lVar6;
    pAVar4 = (AttributeCase *)operator_new(0xb0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Test ",&local_95);
    std::operator+(&local_80,&local_50,"VertexAttrib1f");
    anon_unknown_1::AttributeCase::AttributeCase
              (pAVar4,pCVar2,"vertex_attrib_1f",local_80._M_dataplus._M_p,"VertexAttrib1f",
               SUB41(local_94,0),(bool)in_stack_ffffffffffffff68,(DataType)this_00);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_50);
    pFVar5 = (FloatLoader *)operator_new(8);
    pFVar5->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_01e22b08;
    pAVar4->m_loader = pFVar5;
    this_01 = this_00;
    tcu::TestNode::addChild(this_00,(TestNode *)pAVar4);
    DVar3 = local_94;
    pCVar2 = (this->super_TestCaseGroup).m_context;
    if (cVar1 == '\0') {
      pAVar4 = (AttributeCase *)operator_new(0xb0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Test ",&local_95);
      std::operator+(&local_80,&local_50,"VertexAttrib2f");
      anon_unknown_1::AttributeCase::AttributeCase
                (pAVar4,pCVar2,"vertex_attrib_2f",local_80._M_dataplus._M_p,"VertexAttrib2f",
                 SUB41(local_94,0),(bool)in_stack_ffffffffffffff68,(DataType)this_01);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_50);
      pFVar5 = (FloatLoader *)operator_new(8);
      pFVar5->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_01e22b58;
      pAVar4->m_loader = pFVar5;
      tcu::TestNode::addChild(this_01,(TestNode *)pAVar4);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      pAVar4 = (AttributeCase *)operator_new(0xb0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Test ",&local_95);
      std::operator+(&local_80,&local_50,"VertexAttrib3f");
      DVar3 = local_94;
      anon_unknown_1::AttributeCase::AttributeCase
                (pAVar4,pCVar2,"vertex_attrib_3f",local_80._M_dataplus._M_p,"VertexAttrib3f",
                 SUB41(local_94,0),(bool)in_stack_ffffffffffffff68,(DataType)this_01);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_50);
      pFVar5 = (FloatLoader *)operator_new(8);
      pFVar5->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_01e22b98;
      pAVar4->m_loader = pFVar5;
      this_00 = this_01;
      tcu::TestNode::addChild(this_01,(TestNode *)pAVar4);
      pAVar4 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib4f>
                         ((this->super_TestCaseGroup).m_context,DVar3);
      tcu::TestNode::addChild(this_01,(TestNode *)pAVar4);
      pAVar4 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib1fv>
                         ((this->super_TestCaseGroup).m_context,DVar3);
      tcu::TestNode::addChild(this_01,(TestNode *)pAVar4);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      local_60 = (AttributeCase *)operator_new(0xb0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Test ",&local_95);
      std::operator+(&local_80,&local_50,"VertexAttrib2fv");
      pAVar4 = local_60;
      anon_unknown_1::AttributeCase::AttributeCase
                (local_60,pCVar2,"vertex_attrib_2fv",local_80._M_dataplus._M_p,"VertexAttrib2fv",
                 SUB41(local_94,0),(bool)in_stack_ffffffffffffff68,(DataType)this_00);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_50);
      pFVar5 = (FloatLoader *)operator_new(8);
      pFVar5->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_01e22c58;
      pAVar4->m_loader = pFVar5;
      tcu::TestNode::addChild(this_00,(TestNode *)pAVar4);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      pAVar4 = (AttributeCase *)operator_new(0xb0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Test ",&local_95);
      std::operator+(&local_80,&local_50,"VertexAttrib3fv");
      anon_unknown_1::AttributeCase::AttributeCase
                (pAVar4,pCVar2,"vertex_attrib_3fv",local_80._M_dataplus._M_p,"VertexAttrib3fv",
                 SUB41(local_94,0),(bool)in_stack_ffffffffffffff68,(DataType)this_00);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_50);
      pFVar5 = (FloatLoader *)operator_new(8);
      pFVar5->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_01e22c98;
      pAVar4->m_loader = pFVar5;
      this_01 = this_00;
    }
    else {
      pAVar4 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib4f>
                         (pCVar2,local_94);
      tcu::TestNode::addChild(this_00,(TestNode *)pAVar4);
      pAVar4 = anon_unknown_1::AttributeCase::
               create<deqp::gles2::Functional::(anonymous_namespace)::LoaderVertexAttrib1fv>
                         ((this->super_TestCaseGroup).m_context,DVar3);
    }
    tcu::TestNode::addChild(this_00,(TestNode *)pAVar4);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pAVar4 = (AttributeCase *)operator_new(0xb0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Test ",&local_95);
    std::operator+(&local_80,&local_50,"VertexAttrib4fv");
    anon_unknown_1::AttributeCase::AttributeCase
              (pAVar4,pCVar2,"vertex_attrib_4fv",local_80._M_dataplus._M_p,"VertexAttrib4fv",
               SUB41(local_94,0),(bool)in_stack_ffffffffffffff68,(DataType)this_01);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_50);
    pFVar5 = (FloatLoader *)operator_new(8);
    pFVar5->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_01e22cd8;
    pAVar4->m_loader = pFVar5;
    tcu::TestNode::addChild(this_01,(TestNode *)pAVar4);
    tcu::TestNode::addChild((TestNode *)this,this_01);
    in_RAX = extraout_RAX;
    lVar6 = local_58 + 0x10;
  }
  return (int)in_RAX;
}

Assistant:

void DefaultVertexAttributeTests::init (void)
{
	struct Target
	{
		const char*		name;
		glu::DataType	dataType;
		bool			reducedTestSets;	// !< use reduced coverage
	};

	static const Target floatTargets[] =
	{
		{ "float",	glu::TYPE_FLOAT,		false	},
		{ "vec2",	glu::TYPE_FLOAT_VEC2,	true	},
		{ "vec3",	glu::TYPE_FLOAT_VEC3,	true	},
		{ "vec4",	glu::TYPE_FLOAT_VEC4,	false	},
		{ "mat2",	glu::TYPE_FLOAT_MAT2,	true	},
		{ "mat3",	glu::TYPE_FLOAT_MAT3,	true	},
		{ "mat4",	glu::TYPE_FLOAT_MAT4,	false	},
	};

	// float targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(floatTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, floatTargets[targetNdx].name, (std::string("test with ") + floatTargets[targetNdx].name).c_str());
		const bool					fullSet	= !floatTargets[targetNdx].reducedTestSets;

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, floatTargets[targetNdx].dataType))
#define ADD_REDUCED_CASE(X)	if (fullSet) ADD_CASE(X)

		ADD_CASE		(LoaderVertexAttrib1f);
		ADD_REDUCED_CASE(LoaderVertexAttrib2f);
		ADD_REDUCED_CASE(LoaderVertexAttrib3f);
		ADD_CASE		(LoaderVertexAttrib4f);

		ADD_CASE		(LoaderVertexAttrib1fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib2fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib3fv);
		ADD_CASE		(LoaderVertexAttrib4fv);

#undef ADD_CASE
#undef ADD_REDUCED_CASE

		addChild(group);
	}
}